

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initDDict_internal
                 (ZSTD_DDict *ddict,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_allocFunction p_Var1;
  int *dict_00;
  void *__dest;
  size_t sVar2;
  ulong uVar3;
  
  if (((dict == (void *)0x0) || (dictSize == 0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    ddict->dictBuffer = (void *)0x0;
    ddict->dictContent = dict;
    if (dict == (void *)0x0) {
      dictSize = 0;
    }
  }
  else {
    p_Var1 = (ddict->cMem).customAlloc;
    if (p_Var1 == (ZSTD_allocFunction)0x0) {
      __dest = malloc(dictSize);
    }
    else {
      __dest = (*p_Var1)((ddict->cMem).opaque,dictSize);
    }
    ddict->dictBuffer = __dest;
    ddict->dictContent = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,dict,dictSize);
  }
  ddict->dictSize = dictSize;
  (ddict->entropy).hufTable[0] = 0xc00000c;
  ddict->dictID = 0;
  ddict->entropyPresent = 0;
  if (dictContentType != ZSTD_dct_rawContent) {
    if (dictSize < 8) {
      uVar3 = 0xffffffffffffffe2;
      if (dictContentType != ZSTD_dct_fullDict) {
        uVar3 = 0;
      }
      goto LAB_0019619b;
    }
    dict_00 = (int *)ddict->dictContent;
    uVar3 = 0;
    if (dictContentType == ZSTD_dct_fullDict) {
      uVar3 = 0xffffffffffffffe2;
    }
    if (*dict_00 != -0x13cf5bc9) goto LAB_0019619b;
    ddict->dictID = dict_00[1];
    sVar2 = ZSTD_loadDEntropy(&ddict->entropy,dict_00,dictSize);
    uVar3 = 0xffffffffffffffe2;
    if (0xffffffffffffff88 < sVar2) goto LAB_0019619b;
    ddict->entropyPresent = 1;
  }
  uVar3 = 0;
LAB_0019619b:
  sVar2 = 0;
  if (0xffffffffffffff88 < uVar3) {
    sVar2 = uVar3;
  }
  return sVar2;
}

Assistant:

static size_t ZSTD_initDDict_internal(ZSTD_DDict* ddict,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType)
{
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dict) || (!dictSize)) {
        ddict->dictBuffer = NULL;
        ddict->dictContent = dict;
        if (!dict) dictSize = 0;
    } else {
        void* const internalBuffer = ZSTD_customMalloc(dictSize, ddict->cMem);
        ddict->dictBuffer = internalBuffer;
        ddict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        ZSTD_memcpy(internalBuffer, dict, dictSize);
    }
    ddict->dictSize = dictSize;
    ddict->entropy.hufTable[0] = (HUF_DTable)((ZSTD_HUFFDTABLE_CAPACITY_LOG)*0x1000001);  /* cover both little and big endian */

    /* parse dictionary content */
    FORWARD_IF_ERROR( ZSTD_loadEntropy_intoDDict(ddict, dictContentType) , "");

    return 0;
}